

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NscParserRoutines.cpp
# Opt level: O0

CNscPStackEntry * NscBuildObjectConstant(int nOID)

{
  CNscPStackEntry *this;
  UINT32 in_EDI;
  CNscPStackEntry *unaff_retaddr;
  CNscPStackEntry *pOut;
  undefined4 in_stack_ffffffffffffffe8;
  NscType in_stack_ffffffffffffffec;
  CNscContext *in_stack_fffffffffffffff0;
  
  this = CNscContext::GetPStackEntry
                   (in_stack_fffffffffffffff0,
                    (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),0);
  CNscPStackEntry::SetType(this,in_stack_ffffffffffffffec);
  CNscPStackEntry::PushConstantObject(unaff_retaddr,in_EDI);
  return this;
}

Assistant:

YYSTYPE NscBuildObjectConstant (int nOID)
{
	CNscPStackEntry *pOut = g_pCtx ->GetPStackEntry (__FILE__, __LINE__);
	pOut ->SetType (NscType_Object);
	pOut ->PushConstantObject ((UINT32) nOID);
	return pOut;
}